

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

QVariant * __thiscall
QFileSystemModel::data
          (QVariant *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index,int role)

{
  int iVar1;
  QFileSystemModelPrivate *this_00;
  undefined1 auVar2 [8];
  bool bVar3;
  Permissions PVar4;
  QAbstractFileIconProvider *pQVar5;
  int *piVar6;
  QFileSystemNode *pQVar7;
  QFileSystemNode *this_01;
  long in_FS_OFFSET;
  QIcon icon;
  QIcon moved;
  QIcon local_58;
  undefined1 local_50 [8];
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((index->r < 0) || (iVar1 = index->c, iVar1 < 0)) ||
      ((index->m).ptr == (QAbstractItemModel *)0x0)) ||
     ((index->m).ptr != &this->super_QAbstractItemModel)) goto switchD_006209ab_caseD_fd;
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  switch(role) {
  case 0:
    switch(iVar1) {
    case 0:
switchD_006209ab_caseD_102:
      QFileSystemModelPrivate::name((QString *)local_48,this_00,index);
      break;
    case 1:
switchD_00620a6c_caseD_1:
      QFileSystemModelPrivate::size((QString *)local_48,this_00,index);
      break;
    case 2:
switchD_00620a6c_caseD_2:
      QFileSystemModelPrivate::type((QString *)local_48,this_00,index);
      break;
    case 3:
switchD_00620a6c_caseD_3:
      QFileSystemModelPrivate::time((QFileSystemModelPrivate *)local_48,(time_t *)this_00);
      break;
    default:
switchD_00620a6c_default:
      local_48._0_4_ = 2;
      local_48._4_4_ = 0;
      local_48._8_4_ = 0;
      local_48._12_8_ = 0;
      local_48._20_4_ = 0;
      local_48._24_8_ = "default";
      QMessageLogger::warning(local_48,"data: invalid display value column %d");
      goto switchD_006209ab_caseD_fd;
    }
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_48);
    piVar6 = (int *)CONCAT44(local_48._4_4_,local_48._0_4_);
LAB_00620bf2:
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_48._4_4_,local_48._0_4_),2,0x10);
      }
    }
    break;
  case 1:
    if (iVar1 != 0) goto switchD_006209ab_caseD_fd;
    local_50 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemModelPrivate::icon((QFileSystemModelPrivate *)local_50,(QModelIndex *)this_00);
    bVar3 = QIcon::isNull((QIcon *)local_50);
    if ((bVar3) &&
       (pQVar5 = QFileInfoGatherer::iconProvider
                           ((QFileInfoGatherer *)
                            (this_00->fileInfoGatherer)._M_t.
                            super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                            .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl),
       pQVar5 != (QAbstractFileIconProvider *)0x0)) {
      pQVar7 = &this_00->root;
      if ((index->m).ptr != (QAbstractItemModel *)0x0) {
        pQVar7 = (QFileSystemNode *)index->i;
      }
      this_01 = &this_00->root;
      if (-1 < (index->c | index->r)) {
        this_01 = pQVar7;
      }
      bVar3 = QFileSystemModelPrivate::QFileSystemNode::isDir(this_01);
      (*pQVar5->_vptr_QAbstractFileIconProvider[2])(&local_58,pQVar5,(ulong)(6 - bVar3));
      auVar2 = local_50;
      local_50 = (undefined1  [8])local_58.d;
      local_58.d = (QIconPrivate *)0x0;
      local_48._0_4_ = auVar2._0_4_;
      local_48._4_4_ = auVar2._4_4_;
      QIcon::~QIcon((QIcon *)local_48);
      QIcon::~QIcon(&local_58);
    }
    QIcon::operator_cast_to_QVariant(__return_storage_ptr__,(QIcon *)local_50);
    QIcon::~QIcon((QIcon *)local_50);
    break;
  case 2:
    switch(iVar1) {
    case 0:
      goto switchD_006209ab_caseD_102;
    case 1:
      goto switchD_00620a6c_caseD_1;
    case 2:
      goto switchD_00620a6c_caseD_2;
    case 3:
      goto switchD_00620a6c_caseD_3;
    default:
      goto switchD_00620a6c_default;
    }
  case 7:
    if (iVar1 == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        ::QVariant::QVariant(__return_storage_ptr__,0x82);
        return __return_storage_ptr__;
      }
      goto LAB_00620c54;
    }
  case 3:
  case 4:
  case 5:
  case 6:
switchD_006209ab_caseD_fd:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    break;
  default:
    switch(role) {
    case 0xfc:
      fileInfo((QFileSystemModel *)local_48,(QModelIndex *)this);
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QFileInfo>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QFileInfo>::metaType);
      }
      ::QVariant::moveConstruct
                ((QMetaType)__return_storage_ptr__,
                 &QtPrivate::QMetaTypeInterfaceWrapper<QFileInfo>::metaType);
      QFileInfo::~QFileInfo((QFileInfo *)local_48);
      goto LAB_00620966;
    default:
      goto switchD_006209ab_caseD_fd;
    case 0x101:
      filePath((QString *)local_48,this,index);
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_48);
      piVar6 = (int *)CONCAT44(local_48._4_4_,local_48._0_4_);
      break;
    case 0x102:
      goto switchD_006209ab_caseD_102;
    case 0x103:
      PVar4 = permissions(this,index);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        ::QVariant::QVariant
                  (__return_storage_ptr__,
                   (int)PVar4.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                        super_QFlagsStorage<QFileDevice::Permission>.i);
        return __return_storage_ptr__;
      }
      goto LAB_00620c54;
    }
    goto LAB_00620bf2;
  }
LAB_00620966:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_00620c54:
  __stack_chk_fail();
}

Assistant:

QVariant QFileSystemModel::data(const QModelIndex &index, int role) const
{
    Q_D(const QFileSystemModel);
    if (!index.isValid() || index.model() != this)
        return QVariant();

    switch (role) {
    case Qt::EditRole:
        if (index.column() == QFileSystemModelPrivate::NameColumn)
            return d->name(index);
        Q_FALLTHROUGH();
    case Qt::DisplayRole:
        switch (index.column()) {
        case QFileSystemModelPrivate::NameColumn: return d->displayName(index);
        case QFileSystemModelPrivate::SizeColumn: return d->size(index);
        case QFileSystemModelPrivate::TypeColumn: return d->type(index);
        case QFileSystemModelPrivate::TimeColumn: return d->time(index);
        default:
            qWarning("data: invalid display value column %d", index.column());
            break;
        }
        break;
    case FilePathRole:
        return filePath(index);
    case FileNameRole:
        return d->name(index);
    case FileInfoRole:
        return QVariant::fromValue(fileInfo(index));
    case Qt::DecorationRole:
        if (index.column() == QFileSystemModelPrivate::NameColumn) {
            QIcon icon = d->icon(index);
#if QT_CONFIG(filesystemwatcher)
            if (icon.isNull()) {
                using P = QAbstractFileIconProvider;
                if (auto *provider = d->fileInfoGatherer->iconProvider())
                    icon = provider->icon(d->node(index)->isDir() ? P::Folder: P::File);
            }
#endif // filesystemwatcher
            return icon;
        }
        break;
    case Qt::TextAlignmentRole:
        if (index.column() == QFileSystemModelPrivate::SizeColumn)
            return QVariant(Qt::AlignTrailing | Qt::AlignVCenter);
        break;
    case FilePermissions:
        int p = permissions(index);
        return p;
    }

    return QVariant();
}